

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

void pystring::os::path::splitext_generic
               (string *root,string *ext,string *p,string *sep,string *altsep,string *extsep)

{
  bool bVar1;
  int start;
  int iVar2;
  string local_50;
  
  start = rfind(p,sep,0,0x7fffffff);
  if (altsep->_M_string_length != 0) {
    iVar2 = rfind(p,altsep,0,0x7fffffff);
    if (start <= iVar2) {
      start = iVar2;
    }
  }
  iVar2 = rfind(p,extsep,0,0x7fffffff);
  if (start < iVar2) {
    do {
      start = start + 1;
      if (iVar2 <= start) goto LAB_001096d1;
      slice(&local_50,p,start,0x7fffffff);
      bVar1 = std::operator!=(&local_50,extsep);
      std::__cxx11::string::~string((string *)&local_50);
    } while (!bVar1);
    slice(&local_50,p,0,iVar2);
    std::__cxx11::string::operator=((string *)root,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    slice(&local_50,p,iVar2,0x7fffffff);
    std::__cxx11::string::operator=((string *)ext,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
LAB_001096d1:
    std::__cxx11::string::_M_assign((string *)root);
    std::__cxx11::string::_M_assign((string *)ext);
  }
  return;
}

Assistant:

void splitext_generic(std::string & root, std::string & ext,
                          const std::string & p,
                          const std::string & sep,
                          const std::string & altsep,
                          const std::string & extsep)
    {
        int sepIndex = pystring::rfind(p, sep);
        if(!altsep.empty())
        {
            int altsepIndex = pystring::rfind(p, altsep);
            sepIndex = std::max(sepIndex, altsepIndex);
        }

        int dotIndex = pystring::rfind(p, extsep);
        if(dotIndex > sepIndex)
        {
            // Skip all leading dots
            int filenameIndex = sepIndex + 1;

            while(filenameIndex < dotIndex)
            {
                if(pystring::slice(p,filenameIndex) != extsep)
                {
                    root = pystring::slice(p, 0, dotIndex);
                    ext = pystring::slice(p, dotIndex);
                    return;
                }

                filenameIndex += 1;
            }
        }

        root = p;
        ext = empty_string;
    }